

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utSortByPType.cpp
# Opt level: O1

void __thiscall
SortByPTypeProcessTest_SortByPTypeStep_Test::TestBody
          (SortByPTypeProcessTest_SortByPTypeStep_Test *this)

{
  ulong uVar1;
  uint uVar2;
  aiMesh *rhs;
  bool bVar3;
  int iVar4;
  uint uVar5;
  long lVar6;
  char *pcVar7;
  char *in_R9;
  ulong uVar8;
  long lVar9;
  internal iVar10;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  ScenePreprocessor s;
  AssertHelper local_a0;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_98;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_90;
  string local_88;
  AssertHelper local_68;
  SortByPTypeProcessTest_SortByPTypeStep_Test *local_60;
  long local_58;
  uint local_4c;
  long local_48;
  uint (*local_40) [4];
  ScenePreprocessor local_38;
  
  local_38.scene = (this->super_SortByPTypeProcessTest).mScene;
  local_60 = this;
  Assimp::ScenePreprocessor::ProcessScene(&local_38);
  lVar6 = 0;
  do {
    testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
              ((internal *)&local_88,"result[m]","mScene->mMeshes[m]->mPrimitiveTypes",
               (uint *)((long)::result + lVar6),
               *(uint **)((long)((local_60->super_SortByPTypeProcessTest).mScene)->mMeshes +
                         lVar6 * 2));
    if ((char)local_88._M_dataplus._M_p == '\0') {
      testing::Message::Message((Message *)&local_98);
      pcVar7 = "";
      if ((undefined8 *)local_88._M_string_length != (undefined8 *)0x0) {
        pcVar7 = *(char **)local_88._M_string_length;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_a0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/test/unit/utSortByPType.cpp"
                 ,0xb3,pcVar7);
      testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_98);
      testing::internal::AssertHelper::~AssertHelper(&local_a0);
      if (local_98.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar3 = testing::internal::IsTrue(true);
        if ((bVar3) &&
           (local_98.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(*(long *)local_98.ptr_ + 8))();
        }
        local_98.ptr_ =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_88._M_string_length,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    lVar6 = lVar6 + 4;
  } while (lVar6 != 0x28);
  (*(((local_60->super_SortByPTypeProcessTest).mProcess1)->super_BaseProcess)._vptr_BaseProcess[5])
            ();
  local_48 = 0;
  uVar5 = 0;
  do {
    local_40 = ::num + local_48;
    local_58 = 0;
    do {
      uVar2 = (*local_40)[local_58];
      if (uVar2 != 0) {
        iVar10 = (internal)(uVar5 < ((local_60->super_SortByPTypeProcessTest).mScene)->mNumMeshes);
        local_90.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        local_98.ptr_._0_1_ = iVar10;
        if (!(bool)iVar10) {
          testing::Message::Message((Message *)&local_a0);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    (&local_88,(internal *)&local_98,(AssertionResult *)"real < mScene->mNumMeshes",
                     "false","true",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&local_68,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/test/unit/utSortByPType.cpp"
                     ,0xbb,(char *)CONCAT71(local_88._M_dataplus._M_p._1_7_,
                                            (char)local_88._M_dataplus._M_p));
          testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_a0);
          testing::internal::AssertHelper::~AssertHelper(&local_68);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT71(local_88._M_dataplus._M_p._1_7_,(char)local_88._M_dataplus._M_p) !=
              &local_88.field_2) {
            operator_delete((undefined1 *)
                            CONCAT71(local_88._M_dataplus._M_p._1_7_,(char)local_88._M_dataplus._M_p
                                    ),local_88.field_2._M_allocated_capacity + 1);
          }
          if (local_a0.data_ != (AssertHelperData *)0x0) {
            bVar3 = testing::internal::IsTrue(true);
            if ((bVar3) && (local_a0.data_ != (AssertHelperData *)0x0)) {
              (**(code **)(*(long *)local_a0.data_ + 8))();
            }
            local_a0.data_ = (AssertHelperData *)0x0;
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&local_90,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        rhs = ((local_60->super_SortByPTypeProcessTest).mScene)->mMeshes[uVar5];
        local_98.ptr_._0_1_ = (internal)(rhs != (aiMesh *)0x0);
        local_90.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if (rhs == (aiMesh *)0x0) {
          testing::Message::Message((Message *)&local_a0);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    (&local_88,(internal *)&local_98,(AssertionResult *)"NULL != mesh","false",
                     "true",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&local_68,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/test/unit/utSortByPType.cpp"
                     ,0xbf,(char *)CONCAT71(local_88._M_dataplus._M_p._1_7_,
                                            (char)local_88._M_dataplus._M_p));
          testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_a0);
          testing::internal::AssertHelper::~AssertHelper(&local_68);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT71(local_88._M_dataplus._M_p._1_7_,(char)local_88._M_dataplus._M_p) !=
              &local_88.field_2) {
            operator_delete((undefined1 *)
                            CONCAT71(local_88._M_dataplus._M_p._1_7_,(char)local_88._M_dataplus._M_p
                                    ),local_88.field_2._M_allocated_capacity + 1);
          }
          if (local_a0.data_ != (AssertHelperData *)0x0) {
            bVar3 = testing::internal::IsTrue(true);
            if ((bVar3) && (local_a0.data_ != (AssertHelperData *)0x0)) {
              (**(code **)(*(long *)local_a0.data_ + 8))();
            }
            local_a0.data_ = (AssertHelperData *)0x0;
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&local_90,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        iVar4 = 1 << ((byte)local_58 & 0x1f);
        if (local_58 == 3) {
          iVar4 = 8;
        }
        local_98.ptr_._0_4_ = iVar4;
        testing::internal::CmpHelperEQ<aiPrimitiveType,unsigned_int>
                  ((internal *)&local_88,
                   "((n+1) > 3 ? aiPrimitiveType_POLYGON : (aiPrimitiveType)(1u << ((n+1)-1)))",
                   "mesh->mPrimitiveTypes",(aiPrimitiveType *)&local_98,&rhs->mPrimitiveTypes);
        if ((char)local_88._M_dataplus._M_p == '\0') {
          testing::Message::Message((Message *)&local_98);
          pcVar7 = "";
          if ((undefined8 *)local_88._M_string_length != (undefined8 *)0x0) {
            pcVar7 = *(char **)local_88._M_string_length;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_a0,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/test/unit/utSortByPType.cpp"
                     ,0xc0,pcVar7);
          testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_98);
          testing::internal::AssertHelper::~AssertHelper(&local_a0);
          if (local_98.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            bVar3 = testing::internal::IsTrue(true);
            if ((bVar3) &&
               (local_98.ptr_ !=
                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
              (**(code **)(*(long *)local_98.ptr_ + 8))();
            }
            local_98.ptr_ =
                 (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_88._M_string_length,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        iVar10 = (internal)(rhs->mVertices != (aiVector3D *)0x0);
        local_90.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        local_98.ptr_._0_1_ = iVar10;
        if (!(bool)iVar10) {
          testing::Message::Message((Message *)&local_a0);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    (&local_88,(internal *)&local_98,(AssertionResult *)"NULL != mesh->mVertices",
                     "false","true",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&local_68,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/test/unit/utSortByPType.cpp"
                     ,0xc1,(char *)CONCAT71(local_88._M_dataplus._M_p._1_7_,
                                            (char)local_88._M_dataplus._M_p));
          testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_a0);
          testing::internal::AssertHelper::~AssertHelper(&local_68);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT71(local_88._M_dataplus._M_p._1_7_,(char)local_88._M_dataplus._M_p) !=
              &local_88.field_2) {
            operator_delete((undefined1 *)
                            CONCAT71(local_88._M_dataplus._M_p._1_7_,(char)local_88._M_dataplus._M_p
                                    ),local_88.field_2._M_allocated_capacity + 1);
          }
          if (local_a0.data_ != (AssertHelperData *)0x0) {
            bVar3 = testing::internal::IsTrue(true);
            if ((bVar3) && (local_a0.data_ != (AssertHelperData *)0x0)) {
              (**(code **)(*(long *)local_a0.data_ + 8))();
            }
            local_a0.data_ = (AssertHelperData *)0x0;
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&local_90,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        local_98.ptr_._0_1_ = (internal)(rhs->mNormals != (aiVector3D *)0x0);
        local_90.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if (!(bool)local_98.ptr_._0_1_) {
          testing::Message::Message((Message *)&local_a0);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    (&local_88,(internal *)&local_98,(AssertionResult *)"NULL != mesh->mNormals",
                     "false","true",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&local_68,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/test/unit/utSortByPType.cpp"
                     ,0xc2,(char *)CONCAT71(local_88._M_dataplus._M_p._1_7_,
                                            (char)local_88._M_dataplus._M_p));
          testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_a0);
          testing::internal::AssertHelper::~AssertHelper(&local_68);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT71(local_88._M_dataplus._M_p._1_7_,(char)local_88._M_dataplus._M_p) !=
              &local_88.field_2) {
            operator_delete((undefined1 *)
                            CONCAT71(local_88._M_dataplus._M_p._1_7_,(char)local_88._M_dataplus._M_p
                                    ),local_88.field_2._M_allocated_capacity + 1);
          }
          if (local_a0.data_ != (AssertHelperData *)0x0) {
            bVar3 = testing::internal::IsTrue(true);
            if ((bVar3) && (local_a0.data_ != (AssertHelperData *)0x0)) {
              (**(code **)(*(long *)local_a0.data_ + 8))();
            }
            local_a0.data_ = (AssertHelperData *)0x0;
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&local_90,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        local_98.ptr_._0_1_ = (internal)(rhs->mTangents != (aiVector3D *)0x0);
        local_90.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if (!(bool)local_98.ptr_._0_1_) {
          testing::Message::Message((Message *)&local_a0);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    (&local_88,(internal *)&local_98,(AssertionResult *)"NULL != mesh->mTangents",
                     "false","true",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&local_68,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/test/unit/utSortByPType.cpp"
                     ,0xc3,(char *)CONCAT71(local_88._M_dataplus._M_p._1_7_,
                                            (char)local_88._M_dataplus._M_p));
          testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_a0);
          testing::internal::AssertHelper::~AssertHelper(&local_68);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT71(local_88._M_dataplus._M_p._1_7_,(char)local_88._M_dataplus._M_p) !=
              &local_88.field_2) {
            operator_delete((undefined1 *)
                            CONCAT71(local_88._M_dataplus._M_p._1_7_,(char)local_88._M_dataplus._M_p
                                    ),local_88.field_2._M_allocated_capacity + 1);
          }
          if (local_a0.data_ != (AssertHelperData *)0x0) {
            bVar3 = testing::internal::IsTrue(true);
            if ((bVar3) && (local_a0.data_ != (AssertHelperData *)0x0)) {
              (**(code **)(*(long *)local_a0.data_ + 8))();
            }
            local_a0.data_ = (AssertHelperData *)0x0;
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&local_90,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        local_98.ptr_._0_1_ = (internal)(rhs->mBitangents != (aiVector3D *)0x0);
        local_90.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if (!(bool)local_98.ptr_._0_1_) {
          testing::Message::Message((Message *)&local_a0);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    (&local_88,(internal *)&local_98,(AssertionResult *)"NULL != mesh->mBitangents",
                     "false","true",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&local_68,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/test/unit/utSortByPType.cpp"
                     ,0xc4,(char *)CONCAT71(local_88._M_dataplus._M_p._1_7_,
                                            (char)local_88._M_dataplus._M_p));
          testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_a0);
          testing::internal::AssertHelper::~AssertHelper(&local_68);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT71(local_88._M_dataplus._M_p._1_7_,(char)local_88._M_dataplus._M_p) !=
              &local_88.field_2) {
            operator_delete((undefined1 *)
                            CONCAT71(local_88._M_dataplus._M_p._1_7_,(char)local_88._M_dataplus._M_p
                                    ),local_88.field_2._M_allocated_capacity + 1);
          }
          if (local_a0.data_ != (AssertHelperData *)0x0) {
            bVar3 = testing::internal::IsTrue(true);
            if ((bVar3) && (local_a0.data_ != (AssertHelperData *)0x0)) {
              (**(code **)(*(long *)local_a0.data_ + 8))();
            }
            local_a0.data_ = (AssertHelperData *)0x0;
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&local_90,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        local_98.ptr_._0_1_ = (internal)(rhs->mTextureCoords[0] != (aiVector3D *)0x0);
        local_90.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if (!(bool)local_98.ptr_._0_1_) {
          testing::Message::Message((Message *)&local_a0);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    (&local_88,(internal *)&local_98,
                     (AssertionResult *)"NULL != mesh->mTextureCoords[0]","false","true",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&local_68,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/test/unit/utSortByPType.cpp"
                     ,0xc5,(char *)CONCAT71(local_88._M_dataplus._M_p._1_7_,
                                            (char)local_88._M_dataplus._M_p));
          testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_a0);
          testing::internal::AssertHelper::~AssertHelper(&local_68);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT71(local_88._M_dataplus._M_p._1_7_,(char)local_88._M_dataplus._M_p) !=
              &local_88.field_2) {
            operator_delete((undefined1 *)
                            CONCAT71(local_88._M_dataplus._M_p._1_7_,(char)local_88._M_dataplus._M_p
                                    ),local_88.field_2._M_allocated_capacity + 1);
          }
          if (local_a0.data_ != (AssertHelperData *)0x0) {
            bVar3 = testing::internal::IsTrue(true);
            if ((bVar3) && (local_a0.data_ != (AssertHelperData *)0x0)) {
              (**(code **)(*(long *)local_a0.data_ + 8))();
            }
            local_a0.data_ = (AssertHelperData *)0x0;
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&local_90,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        local_98.ptr_._0_1_ = (internal)(rhs->mNumFaces == uVar2);
        local_90.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if (!(bool)local_98.ptr_._0_1_) {
          testing::Message::Message((Message *)&local_a0);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    (&local_88,(internal *)&local_98,(AssertionResult *)"mesh->mNumFaces == idx",
                     "false","true",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&local_68,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/test/unit/utSortByPType.cpp"
                     ,199,(char *)CONCAT71(local_88._M_dataplus._M_p._1_7_,
                                           (char)local_88._M_dataplus._M_p));
          testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_a0);
          testing::internal::AssertHelper::~AssertHelper(&local_68);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT71(local_88._M_dataplus._M_p._1_7_,(char)local_88._M_dataplus._M_p) !=
              &local_88.field_2) {
            operator_delete((undefined1 *)
                            CONCAT71(local_88._M_dataplus._M_p._1_7_,(char)local_88._M_dataplus._M_p
                                    ),local_88.field_2._M_allocated_capacity + 1);
          }
          if (local_a0.data_ != (AssertHelperData *)0x0) {
            bVar3 = testing::internal::IsTrue(true);
            if ((bVar3) && (local_a0.data_ != (AssertHelperData *)0x0)) {
              (**(code **)(*(long *)local_a0.data_ + 8))();
            }
            local_a0.data_ = (AssertHelperData *)0x0;
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&local_90,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        local_4c = uVar5;
        if (rhs->mNumFaces != 0) {
          uVar1 = local_58 + 1;
          lVar9 = 0;
          uVar8 = 0;
          lVar6 = local_58;
          do {
            uVar5 = *(uint *)((long)&rhs->mFaces->mNumIndices + lVar9);
            bVar3 = uVar1 == uVar5;
            if (lVar6 == 3) {
              bVar3 = 3 < uVar5 || bVar3;
            }
            local_98.ptr_._0_1_ = (internal)bVar3;
            local_90.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
            ;
            if (bVar3 == false) {
              testing::Message::Message((Message *)&local_a0);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        (&local_88,(internal *)&local_98,
                         (AssertionResult *)
                         "face.mNumIndices == (n+1) || (3 == n && face.mNumIndices > 3)","false",
                         "true",in_R9);
              testing::internal::AssertHelper::AssertHelper
                        (&local_68,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/test/unit/utSortByPType.cpp"
                         ,0xca,(char *)CONCAT71(local_88._M_dataplus._M_p._1_7_,
                                                (char)local_88._M_dataplus._M_p));
              testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_a0);
              testing::internal::AssertHelper::~AssertHelper(&local_68);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)CONCAT71(local_88._M_dataplus._M_p._1_7_,(char)local_88._M_dataplus._M_p) !=
                  &local_88.field_2) {
                operator_delete((undefined1 *)
                                CONCAT71(local_88._M_dataplus._M_p._1_7_,
                                         (char)local_88._M_dataplus._M_p),
                                local_88.field_2._M_allocated_capacity + 1);
              }
              lVar6 = local_58;
              if (local_a0.data_ != (AssertHelperData *)0x0) {
                bVar3 = testing::internal::IsTrue(true);
                if ((bVar3) && (local_a0.data_ != (AssertHelperData *)0x0)) {
                  (**(code **)(*(long *)local_a0.data_ + 8))();
                }
                local_a0.data_ = (AssertHelperData *)0x0;
              }
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset(&local_90,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
            uVar8 = uVar8 + 1;
            lVar9 = lVar9 + 0x10;
          } while (uVar8 < rhs->mNumFaces);
        }
        uVar5 = local_4c + 1;
      }
      local_58 = local_58 + 1;
    } while (local_58 != 4);
    local_48 = local_48 + 1;
  } while (local_48 != 10);
  return;
}

Assistant:

TEST_F(SortByPTypeProcessTest, SortByPTypeStep) {
    ScenePreprocessor s(mScene);
    s.ProcessScene();
    for (unsigned int m = 0; m< 10;++m)
        EXPECT_EQ(result[m], mScene->mMeshes[m]->mPrimitiveTypes);

    mProcess1->Execute(mScene);

    unsigned int idx = 0;
    for (unsigned int m = 0,real = 0; m< 10;++m) {
        for (unsigned int n = 0; n < 4;++n) {
            if ((idx = num[m][n])) {
                EXPECT_TRUE(real < mScene->mNumMeshes);

                aiMesh* mesh = mScene->mMeshes[real];

                EXPECT_TRUE(NULL != mesh);
                EXPECT_EQ(AI_PRIMITIVE_TYPE_FOR_N_INDICES(n+1), mesh->mPrimitiveTypes);
                EXPECT_TRUE(NULL != mesh->mVertices);
                EXPECT_TRUE(NULL != mesh->mNormals);
                EXPECT_TRUE(NULL != mesh->mTangents);
                EXPECT_TRUE(NULL != mesh->mBitangents);
                EXPECT_TRUE(NULL != mesh->mTextureCoords[0]);

                EXPECT_TRUE(mesh->mNumFaces == idx);
                for (unsigned int f = 0; f < mesh->mNumFaces;++f) {
                    aiFace& face = mesh->mFaces[f];
                    EXPECT_TRUE(face.mNumIndices == (n+1) || (3 == n && face.mNumIndices > 3));
                }
                ++real;
            }
        }
    }
}